

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

wstring * intToString_abi_cxx11_(wstring *__return_storage_ptr__,uint value,int digits)

{
  int iVar1;
  wchar_t buf [9];
  wchar_t awStack_58 [12];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  if (8 < digits) {
    iVar1 = digits + 1;
    do {
      std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
      iVar1 = iVar1 + -1;
    } while (9 < iVar1);
    digits = 8;
  }
  swprintf(awStack_58,9,L"%*d",(ulong)(uint)digits,value);
  std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::wstring intToString(unsigned int value, int digits)
{
	std::wstring result;
	result.reserve(digits);

	while (digits > 8)
	{
		result += ' ';
		digits--;
	}
	
	wchar_t buf[9];
	swprintf(buf,9,L"%*d",digits,value);
	result += buf;

	return result;
}